

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O2

void __thiscall pbrt::IPCChannel::Connect(IPCChannel *this)

{
  addrinfo *paVar1;
  int iVar2;
  int *piVar3;
  addrinfo **__pai;
  int in_stack_ffffffffffffff6c;
  addrinfo *addrinfo;
  int vb;
  undefined4 uStack_84;
  addrinfo hints;
  
  hints.ai_flags = this->socketFd;
  vb = 0xffffffff;
  if (hints.ai_flags != -1) {
    LogFatal<char_const(&)[9],char_const(&)[5],char_const(&)[9],int&,char_const(&)[5],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/display.cpp"
               ,0x6d,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [9])"socketFd",
               (char (*) [5])0x587dbb,(char (*) [9])"socketFd",&hints.ai_flags,
               (char (*) [5])0x587dbb,&vb);
  }
  if (LOGGING_LogLevel < 1) {
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/display.cpp"
        ,0x6f,"Trying to connect to display server");
  }
  hints.ai_canonname = (char *)0x0;
  hints.ai_next = (addrinfo *)0x0;
  hints.ai_flags = 0;
  hints.ai_protocol = 0;
  hints.ai_addrlen = 0;
  hints._20_4_ = 0;
  hints.ai_addr = (sockaddr *)0x0;
  hints.ai_family = 0;
  hints.ai_socktype = 1;
  __pai = (addrinfo **)&addrinfo;
  iVar2 = getaddrinfo((this->address)._M_dataplus._M_p,(this->port)._M_dataplus._M_p,
                      (addrinfo *)&hints,__pai);
  if (iVar2 != 0) {
    _vb = gai_strerror(iVar2);
    ErrorExit<char_const*>("%s",(char **)&vb);
  }
  this->socketFd = -1;
  while (paVar1 = *__pai, paVar1 != (addrinfo *)0x0) {
    iVar2 = socket(paVar1->ai_family,paVar1->ai_socktype,paVar1->ai_protocol);
    this->socketFd = iVar2;
    if (iVar2 == -1) {
      if (LOGGING_LogLevel < 1) {
        LastError();
        ErrorString_abi_cxx11_(in_stack_ffffffffffffff6c);
        Log<std::__cxx11::string>
                  (Verbose,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/display.cpp"
                   ,0x7c,"socket() failed: %s",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb);
        std::__cxx11::string::~string((string *)&vb);
      }
    }
    else {
      iVar2 = connect(iVar2,paVar1->ai_addr,paVar1->ai_addrlen);
      if (iVar2 != -1) break;
      piVar3 = __errno_location();
      if (*piVar3 == 0x6f) {
        if (LOGGING_LogLevel < 1) {
          Log(Verbose,
              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/display.cpp"
              ,0x87,"Connection refused. Will try again...");
        }
      }
      else if (LOGGING_LogLevel < 1) {
        ErrorString_abi_cxx11_(in_stack_ffffffffffffff6c);
        Log<std::__cxx11::string>
                  (Verbose,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/display.cpp"
                   ,0x89,"connect() failed: %s",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb);
        std::__cxx11::string::~string((string *)&vb);
      }
      close(this->socketFd);
      this->socketFd = -1;
    }
    __pai = &paVar1->ai_next;
  }
  freeaddrinfo((addrinfo *)addrinfo);
  if ((this->socketFd != -1) && (LOGGING_LogLevel < 1)) {
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/display.cpp"
        ,0x95,"Connected to display server");
  }
  return;
}

Assistant:

void IPCChannel::Connect() {
    CHECK_EQ(socketFd, INVALID_SOCKET);

    LOG_VERBOSE("Trying to connect to display server");

    struct addrinfo hints = {}, *addrinfo;
    hints.ai_family = PF_UNSPEC;
    hints.ai_socktype = SOCK_STREAM;
    int err = getaddrinfo(address.c_str(), port.c_str(), &hints, &addrinfo);
    if (err)
        ErrorExit("%s", gai_strerror(err));

    socketFd = INVALID_SOCKET;
    for (struct addrinfo *ptr = addrinfo; ptr; ptr = ptr->ai_next) {
        socketFd = socket(ptr->ai_family, ptr->ai_socktype, ptr->ai_protocol);
        if (socketFd == INVALID_SOCKET) {
            LOG_VERBOSE("socket() failed: %s", ErrorString());
            continue;
        }

        if (connect(socketFd, ptr->ai_addr, ptr->ai_addrlen) == SOCKET_ERROR) {
#ifdef PBRT_IS_WINDOWS
            int err = WSAGetLastError();
#else
            int err = errno;
#endif
            if (err == SocketError::ConnRefused)
                LOG_VERBOSE("Connection refused. Will try again...");
            else
                LOG_VERBOSE("connect() failed: %s", ErrorString(err));

            closeSocket(socketFd);
            socketFd = INVALID_SOCKET;
            continue;
        }

        break;  // success
    }

    freeaddrinfo(addrinfo);
    if (socketFd != INVALID_SOCKET)
        LOG_VERBOSE("Connected to display server");
}